

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

string * __thiscall
bssl::(anonymous_namespace)::CertErrorParams2SizeT::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *__lhs;
  int i;
  int i_00;
  string local_158;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  CertErrorParams2SizeT *this_local;
  
  __lhs = *(char **)((long)this + 8);
  local_18 = this;
  this_local = (CertErrorParams2SizeT *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,": ",&local_d9);
  ::std::operator+(&local_b8,__lhs,&local_d8);
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_110,(string_util *)(ulong)*(uint *)((long)this + 0x10),i);
  ::std::operator+(&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110);
  ::std::operator+(&local_78,&local_98,"\n");
  ::std::operator+(&local_58,&local_78,*(char **)((long)this + 0x18));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,": ",&local_131);
  ::std::operator+(&local_38,&local_58,&local_130);
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_158,(string_util *)(ulong)*(uint *)((long)this + 0x20),i_00);
  ::std::operator+(__return_storage_ptr__,&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158);
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::allocator<char>::~allocator(&local_d9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToDebugString() const override {
    return name1_ + std::string(": ") +
           bssl::string_util::NumberToDecimalString(value1_) + "\n" + name2_ +
           std::string(": ") +
           bssl::string_util::NumberToDecimalString(value2_);
  }